

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vc1StreamReader.h
# Opt level: O2

void __thiscall VC1StreamReader::VC1StreamReader(VC1StreamReader *this)

{
  MPEGStreamReader::MPEGStreamReader(&this->super_MPEGStreamReader);
  (this->super_MPEGStreamReader).super_AbstractStreamReader.super_BaseAbstractStreamReader.
  _vptr_BaseAbstractStreamReader = (_func_int **)&PTR__VC1StreamReader_0024c730;
  (this->m_entryPointBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_entryPointBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_entryPointBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_seqBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_seqBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_seqBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  VC1SequenceHeader::VC1SequenceHeader(&this->m_sequence);
  (this->m_frame).super_VC1Unit.bitReader.super_BitStream.m_totalBits = 0;
  (this->m_frame).tff = 0;
  (this->m_frame).rff = 0;
  (this->m_frame).rptfrmBitPos = 0;
  (this->m_frame).super_VC1Unit.bitReader.super_BitStream.m_buffer = (uint *)0x0;
  (this->m_frame).super_VC1Unit.bitReader.super_BitStream.m_initBuffer = (uint *)0x0;
  (this->m_frame).super_VC1Unit.bitReader.m_curVal = 0;
  (this->m_frame).super_VC1Unit.bitReader.m_bitLeft = 0;
  (this->m_frame).super_VC1Unit.m_nalBuffer = (uint8_t *)0x0;
  (this->m_frame).super_VC1Unit.m_nalBufferLen = 0;
  (this->m_frame).fcm = 0;
  (this->m_frame).pict_type = I_TYPE;
  (this->m_frame).rptfrm = '\0';
  this->m_isFirstFrame = true;
  this->m_spsFound = 0;
  this->m_lastIFrame = false;
  this->m_firstFileFrame = false;
  this->m_decodedAfterSeq = false;
  this->m_prevDtsInc = 0;
  (this->super_MPEGStreamReader).m_longCodesAllowed = false;
  this->m_nextFrameAddr = (uint8_t *)0x0;
  return;
}

Assistant:

VC1StreamReader()
    {
        m_isFirstFrame = true;
        m_spsFound = 0;
        m_frame.pict_type = VC1PictType::I_TYPE;
        m_lastIFrame = false;
        m_decodedAfterSeq = false;
        m_firstFileFrame = false;
        m_prevDtsInc = false;
        m_longCodesAllowed = false;
        m_nextFrameAddr = nullptr;
    }